

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O2

void __thiscall Chromosome::crossover(Chromosome *this,Chromosome *other)

{
  __normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_> __last;
  __normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_> __first;
  result_type_conflict2 rVar1;
  __normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_> __first_00;
  vector<TURNCODE,_std::allocator<TURNCODE>_> nlist2;
  vector<TURNCODE,_std::allocator<TURNCODE>_> nlist1;
  uniform_int_distribution<int> crossover;
  _Vector_base<TURNCODE,_std::allocator<TURNCODE>_> local_68;
  _Vector_base<TURNCODE,_std::allocator<TURNCODE>_> local_48;
  uniform_int_distribution<int> local_30;
  
  local_30._M_param._M_b =
       (int)((ulong)((long)(this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
  local_30._M_param._M_a = 1;
  rVar1 = std::uniform_int_distribution<int>::operator()(&local_30,&randomDevice2);
  __first._M_current =
       (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current = __first._M_current + rVar1;
  __first_00._M_current =
       (other->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
       super__Vector_impl_data._M_start + rVar1;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (TURNCODE *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (TURNCODE *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (TURNCODE *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<TURNCODE,std::allocator<TURNCODE>>::
  insert<__gnu_cxx::__normal_iterator<TURNCODE*,std::vector<TURNCODE,std::allocator<TURNCODE>>>,void>
            ((vector<TURNCODE,std::allocator<TURNCODE>> *)&local_48,(const_iterator)0x0,__first,
             __last);
  std::vector<TURNCODE,std::allocator<TURNCODE>>::
  insert<__gnu_cxx::__normal_iterator<TURNCODE*,std::vector<TURNCODE,std::allocator<TURNCODE>>>,void>
            ((vector<TURNCODE,std::allocator<TURNCODE>> *)&local_48,
             (const_iterator)local_48._M_impl.super__Vector_impl_data._M_finish,__first_00,
             (__normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>)
             (other->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<TURNCODE,std::allocator<TURNCODE>>::
  insert<__gnu_cxx::__normal_iterator<TURNCODE*,std::vector<TURNCODE,std::allocator<TURNCODE>>>,void>
            ((vector<TURNCODE,std::allocator<TURNCODE>> *)&local_68,
             (const_iterator)local_68._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>)
             (other->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
             super__Vector_impl_data._M_start,__first_00);
  std::vector<TURNCODE,std::allocator<TURNCODE>>::
  insert<__gnu_cxx::__normal_iterator<TURNCODE*,std::vector<TURNCODE,std::allocator<TURNCODE>>>,void>
            ((vector<TURNCODE,std::allocator<TURNCODE>> *)&local_68,
             (const_iterator)local_68._M_impl.super__Vector_impl_data._M_finish,__last,
             (__normal_iterator<TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>)
             (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<TURNCODE,_std::allocator<TURNCODE>_>::_M_move_assign(&this->turnList,&local_48);
  std::vector<TURNCODE,_std::allocator<TURNCODE>_>::_M_move_assign(&other->turnList,&local_68);
  this->changed = true;
  this->id = idGlobal + 1;
  other->changed = true;
  idGlobal = idGlobal + 2;
  other->id = idGlobal;
  std::_Vector_base<TURNCODE,_std::allocator<TURNCODE>_>::~_Vector_base(&local_68);
  std::_Vector_base<TURNCODE,_std::allocator<TURNCODE>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void Chromosome::crossover(Chromosome& other) {

    std::uniform_int_distribution<int> crossover(1, turnList.size()-1);
    int position =  crossover(randomDevice2);

    std::vector<TURNCODE>& list1 = this->turnList;
    std::vector<TURNCODE>& list2 = other.turnList;

    auto it1 = list1.begin();
    std::advance(it1, position);
    auto it2 = list2.begin();
    std::advance(it2, position);

    std::vector<TURNCODE> nlist1;
    std::vector<TURNCODE> nlist2;
    nlist1.insert(nlist1.begin(), list1.begin(), it1);
    nlist1.insert(nlist1.end(), it2, list2.end());
    nlist2.insert(nlist2.begin(), list2.begin(), it2);
    nlist2.insert(nlist2.end(), it1, list1.end());

    list1 = std::move(nlist1);
    list2 = std::move(nlist2);


    // Mark as changed for recalculation of fitness, collusion, path etc.
    this->changed = true;
    this->setId();
    other.changed = true;
    other.setId();
}